

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool CreateSubMesh(ON_Mesh *mesh,ON_2fPointArray *tc,int nFis,int *pFis,ON_Mesh *subMeshOut)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_MeshFace *this;
  ON_MeshFace *pOVar4;
  mapped_type *pmVar5;
  ON_3fPointArray *this_00;
  ON_3fPoint *x;
  ON_3dPointArray *this_01;
  ON_3dPoint *x_00;
  ON_3fVectorArray *pOVar6;
  ON_3fVector *pOVar7;
  ON_2fPointArray *this_02;
  ON_2fPoint *x_01;
  pointer ppVar8;
  int targetVi_1;
  int targetVi;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_790;
  iterator vmapit;
  int local_780;
  int sourceVi;
  int fvi;
  int fvc;
  ON_MeshFace *targetFace;
  ON_MeshFace *sourceFace;
  undefined1 local_760 [4];
  int i;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  vmap;
  ON_Mesh local_718;
  ON_Mesh *local_38;
  ON_Mesh *subMeshOut_local;
  int *pFis_local;
  ON_SimpleArray<ON_2fPoint> *pOStack_20;
  int nFis_local;
  ON_2fPointArray *tc_local;
  ON_Mesh *mesh_local;
  
  if ((nFis == 0) || (pFis == (int *)0x0)) {
    mesh_local._7_1_ = 0;
  }
  else {
    local_38 = subMeshOut;
    subMeshOut_local = (ON_Mesh *)pFis;
    pFis_local._4_4_ = nFis;
    pOStack_20 = &tc->super_ON_SimpleArray<ON_2fPoint>;
    tc_local = (ON_2fPointArray *)mesh;
    iVar2 = ON_SimpleArray<ON_2fPoint>::Count(&tc->super_ON_SimpleArray<ON_2fPoint>);
    iVar3 = ON_Mesh::VertexCount((ON_Mesh *)tc_local);
    if (iVar2 == iVar3) {
      ON_Mesh::ON_Mesh(&local_718,pFis_local._4_4_,0,false,false);
      ON_Mesh::operator=(local_38,&local_718);
      ON_Mesh::~ON_Mesh(&local_718);
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_760);
      for (sourceFace._4_4_ = 0; sourceFace._4_4_ < pFis_local._4_4_;
          sourceFace._4_4_ = sourceFace._4_4_ + 1) {
        this = ON_SimpleArray<ON_MeshFace>::operator[]
                         ((ON_SimpleArray<ON_MeshFace> *)
                          &tc_local[2].super_ON_SimpleArray<ON_2fPoint>.m_count,
                          *(int *)((long)&(subMeshOut_local->super_ON_Geometry).super_ON_Object.
                                          _vptr_ON_Object + (long)sourceFace._4_4_ * 4));
        pOVar4 = ON_SimpleArray<ON_MeshFace>::AppendNew(&local_38->m_F);
        bVar1 = ON_MeshFace::IsQuad(this);
        iVar2 = 3;
        if (bVar1) {
          iVar2 = 4;
        }
        for (local_780 = 0; local_780 < iVar2; local_780 = local_780 + 1) {
          vmapit.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur._4_4_ =
               this->vi[local_780];
          local_790._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::find((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_760,
                      (key_type *)
                      ((long)&vmapit.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                              _M_cur + 4));
          _targetVi_1 = (__node_type *)
                        std::
                        unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        ::end((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)local_760);
          bVar1 = std::__detail::operator==
                            (&local_790,
                             (_Node_iterator_base<std::pair<const_int,_int>,_false> *)&targetVi_1);
          if (bVar1) {
            iVar3 = ON_SimpleArray<ON_3fPoint>::Count
                              (&(local_38->m_V).super_ON_SimpleArray<ON_3fPoint>);
            pOVar4->vi[local_780] = iVar3;
            pmVar5 = std::
                     unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_760,
                                  (key_type *)
                                  ((long)&vmapit.
                                          super__Node_iterator_base<std::pair<const_int,_int>,_false>
                                          ._M_cur + 4));
            *pmVar5 = iVar3;
            this_00 = &local_38->m_V;
            x = ON_SimpleArray<ON_3fPoint>::operator[]
                          ((ON_SimpleArray<ON_3fPoint> *)
                           &tc_local[1].super_ON_SimpleArray<ON_2fPoint>.m_count,
                           vmapit.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur
                           ._4_4_);
            ON_SimpleArray<ON_3fPoint>::Append(&this_00->super_ON_SimpleArray<ON_3fPoint>,x);
            bVar1 = ON_Mesh::HasDoublePrecisionVertices((ON_Mesh *)tc_local);
            if (bVar1) {
              this_01 = &local_38->m_dV;
              x_00 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)
                                &(tc_local->super_ON_SimpleArray<ON_2fPoint>).m_count,
                                vmapit.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                _M_cur._4_4_);
              ON_SimpleArray<ON_3dPoint>::Append(&this_01->super_ON_SimpleArray<ON_3dPoint>,x_00);
            }
            bVar1 = ON_Mesh::HasVertexNormals((ON_Mesh *)tc_local);
            if (bVar1) {
              pOVar6 = &local_38->m_N;
              pOVar7 = ON_SimpleArray<ON_3fVector>::operator[]
                                 ((ON_SimpleArray<ON_3fVector> *)
                                  &tc_local[0xc].super_ON_SimpleArray<ON_2fPoint>.m_count,
                                  vmapit.super__Node_iterator_base<std::pair<const_int,_int>,_false>
                                  ._M_cur._4_4_);
              ON_SimpleArray<ON_3fVector>::Append(&pOVar6->super_ON_SimpleArray<ON_3fVector>,pOVar7)
              ;
            }
            this_02 = &local_38->m_T;
            x_01 = ON_SimpleArray<ON_2fPoint>::operator[]
                             (pOStack_20,
                              vmapit.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                              _M_cur._4_4_);
            ON_SimpleArray<ON_2fPoint>::Append(&this_02->super_ON_SimpleArray<ON_2fPoint>,x_01);
          }
          else {
            ppVar8 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::
                     operator->((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)
                                &local_790);
            pOVar4->vi[local_780] = ppVar8->second;
          }
          if (iVar2 == 3) {
            pOVar4->vi[3] = pOVar4->vi[2];
          }
        }
        bVar1 = ON_Mesh::HasFaceNormals((ON_Mesh *)tc_local);
        if (bVar1) {
          pOVar6 = &local_38->m_FN;
          pOVar7 = ON_SimpleArray<ON_3fVector>::operator[]
                             ((ON_SimpleArray<ON_3fVector> *)
                              &tc_local[0xd].super_ON_SimpleArray<ON_2fPoint>.m_count,
                              *(int *)((long)&(subMeshOut_local->super_ON_Geometry).super_ON_Object.
                                              _vptr_ON_Object + (long)sourceFace._4_4_ * 4));
          ON_SimpleArray<ON_3fVector>::Append(&pOVar6->super_ON_SimpleArray<ON_3fVector>,pOVar7);
        }
      }
      mesh_local._7_1_ = 1;
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)local_760);
    }
    else {
      mesh_local._7_1_ = 0;
    }
  }
  return (bool)(mesh_local._7_1_ & 1);
}

Assistant:

bool CreateSubMesh(const ON_Mesh& mesh, const ON_2fPointArray& tc, const int nFis, const int* pFis, ON_Mesh& subMeshOut)
{
  if (nFis == 0 || pFis == nullptr)
    return false;
  if (tc.Count() != mesh.VertexCount())
    return false;

  subMeshOut = ON_Mesh(nFis, 0, 0, 0);
  std::unordered_map<int, int> vmap;
  for (int i = 0; i < nFis; i++)
  {
    const ON_MeshFace& sourceFace = mesh.m_F[pFis[i]];
    ON_MeshFace& targetFace = subMeshOut.m_F.AppendNew();
    const int fvc = sourceFace.IsQuad() ? 4 : 3;
    for (int fvi = 0; fvi < fvc; fvi++)
    {
      const int sourceVi = sourceFace.vi[fvi];
      const auto vmapit = vmap.find(sourceVi);
      if (vmapit == vmap.end())
      {
        const int targetVi = subMeshOut.m_V.Count();
        targetFace.vi[fvi] = targetVi;
        vmap[sourceVi] = targetVi;
        subMeshOut.m_V.Append(mesh.m_V[sourceVi]);
        if (mesh.HasDoublePrecisionVertices())
          subMeshOut.m_dV.Append(mesh.m_dV[sourceVi]);
        if (mesh.HasVertexNormals())
          subMeshOut.m_N.Append(mesh.m_N[sourceVi]);
        subMeshOut.m_T.Append(tc[sourceVi]);
      }
      else
      {
        const int targetVi = vmapit->second;
        targetFace.vi[fvi] = targetVi;
      }
      if (fvc == 3)
        targetFace.vi[3] = targetFace.vi[2];
    }
    if (mesh.HasFaceNormals())
      subMeshOut.m_FN.Append(mesh.m_FN[pFis[i]]);
  }
  return true;
}